

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initCompilerTool(VcprojGenerator *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  VCConfiguration *conf;
  QString placement;
  ProString *in_stack_fffffffffffffc48;
  ProKey *v;
  QMakeProject *in_stack_fffffffffffffc50;
  QMakeProject *this_00;
  QMakeProject *in_stack_fffffffffffffc58;
  ProKey *in_stack_fffffffffffffc60;
  ProStringList *options;
  QMakeEvaluator *in_stack_fffffffffffffc68;
  VCToolBase *this_01;
  ProStringList *in_stack_fffffffffffffc70;
  ProStringList *this_02;
  char *in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc88;
  ProStringList local_2d0 [2];
  VCToolBase local_2a0 [9];
  undefined1 local_258 [568];
  char16_t *local_20;
  qsizetype local_18;
  Data *local_10;
  char16_t *local_8;
  
  local_8 = *(char16_t **)(in_FS_OFFSET + 0x28);
  local_20 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_18 = -0x5555555555555556;
  local_10 = (Data *)0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
  QMakeEvaluator::first(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  ProString::toQString(in_stack_fffffffffffffc48);
  ProString::~ProString((ProString *)0x294963);
  ProKey::~ProKey((ProKey *)0x294970);
  bVar1 = QString::isEmpty((QString *)0x29497d);
  if (bVar1) {
    QString::operator=((QString *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc78);
  }
  if (0x9f < *(int *)(in_RDI + 0x26c)) {
    *(undefined4 *)(in_RDI + 0x524) = 0;
  }
  QString::operator=((QString *)(in_RDI + 0x3d0),(QString *)&local_20);
  QString::operator=((QString *)(in_RDI + 0x500),(QString *)&local_20);
  *(undefined4 *)(in_RDI + 0x460) = 0;
  if ((*(byte *)(in_RDI + 400) & 1) != 0) {
    *(undefined4 *)(in_RDI + 0x5e8) = 3;
    local_258._432_16_ =
         (undefined1  [16])
         ::operator+((char (*) [11])in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_string);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_char_(&)[11],_QString_&> *)in_stack_fffffffffffffc48);
    QString::operator=((QString *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_string);
    QString::~QString((QString *)0x294ad4);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    QMakeEvaluator::first(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    ProString::toQString(in_stack_fffffffffffffc48);
    QString::operator=((QString *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_string);
    QString::~QString((QString *)0x294b61);
    ProString::~ProString((ProString *)0x294b6e);
    ProKey::~ProKey((ProKey *)0x294b7b);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    QMakeProject::values(in_stack_fffffffffffffc50,(ProKey *)in_stack_fffffffffffffc48);
    ProStringList::toQStringList(in_stack_fffffffffffffc70);
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffc50,
               (QList<QString> *)in_stack_fffffffffffffc48);
    QList<QString>::~QList((QList<QString> *)0x294bfb);
    ProKey::~ProKey((ProKey *)0x294c08);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
  QMakeProject::values(in_stack_fffffffffffffc50,(ProKey *)in_stack_fffffffffffffc48);
  relevantCFlags(in_stack_fffffffffffffc70);
  VCToolBase::parseOptions
            ((VCToolBase *)in_stack_fffffffffffffc68,(ProStringList *)in_stack_fffffffffffffc60);
  ProStringList::~ProStringList((ProStringList *)0x294c85);
  ProKey::~ProKey((ProKey *)0x294c92);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
  QMakeProject::values(in_stack_fffffffffffffc50,(ProKey *)in_stack_fffffffffffffc48);
  VCToolBase::parseOptions
            ((VCToolBase *)in_stack_fffffffffffffc68,(ProStringList *)in_stack_fffffffffffffc60);
  ProKey::~ProKey((ProKey *)0x294cfa);
  QString::QString((QString *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc88);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_fffffffffffffc58,(QString *)in_stack_fffffffffffffc50,
                     SUB81((ulong)in_stack_fffffffffffffc48 >> 0x38,0));
  QString::~QString((QString *)0x294d4a);
  if (bVar1) {
    QString::QString((QString *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc88);
    QList<QString>::operator+=
              ((QList<QString> *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_string);
    QString::~QString((QString *)0x294d9b);
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc88);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffffc58,(QString *)in_stack_fffffffffffffc50,
                       SUB81((ulong)in_stack_fffffffffffffc48 >> 0x38,0));
    QString::~QString((QString *)0x294ded);
    if (bVar1) {
      QString::QString((QString *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc88);
      QList<QString>::operator+=
                ((QList<QString> *)in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->m_string);
      QString::~QString((QString *)0x294e3b);
    }
  }
  v = *(ProKey **)(in_RDI + 0xd8);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)v);
  QMakeProject::values(in_stack_fffffffffffffc50,v);
  this_00 = (QMakeProject *)local_258;
  ProStringList::toQStringList(in_stack_fffffffffffffc70);
  QList<QString>::operator+=((QList<QString> *)this_00,(QList<QString> *)v);
  QList<QString>::~QList((QList<QString> *)0x294eaf);
  ProKey::~ProKey((ProKey *)0x294eb9);
  options = *(ProStringList **)(in_RDI + 0xd8);
  this_02 = local_2d0;
  ProKey::ProKey((ProKey *)this_00,(char *)v);
  QMakeProject::values(this_00,v);
  this_01 = local_2a0;
  ProStringList::toQStringList(this_02);
  QList<QString>::operator+=((QList<QString> *)this_00,(QList<QString> *)v);
  QList<QString>::~QList((QList<QString> *)0x294f2d);
  ProKey::~ProKey((ProKey *)0x294f37);
  ProKey::ProKey((ProKey *)this_00,(char *)v);
  QMakeProject::values(this_00,v);
  VCToolBase::parseOptions(this_01,options);
  ProKey::~ProKey((ProKey *)0x294f9e);
  QString::~QString((QString *)0x294fab);
  if (*(char16_t **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initCompilerTool()
{
    QString placement = project->first("OBJECTS_DIR").toQString();
    if(placement.isEmpty())
        placement = ".\\";

    VCConfiguration &conf = vcProject.Configuration;
    if (conf.CompilerVersion >= NET2010) {
        // adjust compiler tool defaults for VS 2010 and above
        conf.compiler.Optimization = optimizeDisabled;
    }
    conf.compiler.AssemblerListingLocation = placement ;
    conf.compiler.ObjectFile = placement ;
    conf.compiler.ExceptionHandling = ehNone;
    // PCH
    if (usePCH) {
        conf.compiler.UsePrecompiledHeader     = pchUseUsingSpecific;
        conf.compiler.PrecompiledHeaderFile    = "$(IntDir)\\" + precompPch;
        conf.compiler.PrecompiledHeaderThrough = project->first("PRECOMPILED_HEADER").toQString();
        conf.compiler.ForcedIncludeFiles       = project->values("PRECOMPILED_HEADER").toQStringList();
    }

    conf.compiler.parseOptions(relevantCFlags(project->values("QMAKE_CFLAGS")));
    conf.compiler.parseOptions(project->values("QMAKE_CXXFLAGS"));

    if (project->isActiveConfig("windows"))
        conf.compiler.PreprocessorDefinitions += "_WINDOWS";
    else if (project->isActiveConfig("console"))
        conf.compiler.PreprocessorDefinitions += "_CONSOLE";

    conf.compiler.PreprocessorDefinitions += project->values("DEFINES").toQStringList();
    conf.compiler.PreprocessorDefinitions += project->values("PRL_EXPORT_DEFINES").toQStringList();
    conf.compiler.parseOptions(project->values("MSVCPROJ_INCPATH"));
}